

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux_test.cpp
# Opt level: O0

void __thiscall license::test::read_disk_id::test_method(read_disk_id *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  LCC_API_VIRTUALIZATION_SUMMARY LVar3;
  lazy_ostream *plVar4;
  size_type sVar5;
  reference __src;
  bool local_9dd;
  byte local_9dc;
  byte local_9db;
  byte local_9da;
  basic_cstring<const_char> local_990;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]> local_980;
  assertion_result local_960;
  basic_cstring<const_char> local_948;
  basic_cstring<const_char> local_938;
  undefined4 local_924;
  basic_cstring<const_char> local_920;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_910;
  basic_cstring<const_char> local_8e8;
  basic_cstring<const_char> local_8d8;
  basic_cstring<const_char> local_8c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]> local_8b8;
  assertion_result local_898;
  basic_cstring<const_char> local_880;
  basic_cstring<const_char> local_870;
  basic_cstring<const_char> local_860;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]> local_850;
  assertion_result local_830;
  basic_cstring<const_char> local_818;
  basic_cstring<const_char> local_808;
  basic_cstring<const_char> local_7f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]> local_7e8;
  assertion_result local_7c8;
  basic_cstring<const_char> local_7b0;
  basic_cstring<const_char> local_7a0;
  basic_cstring<const_char> local_790;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]> local_780;
  assertion_result local_760;
  basic_cstring<const_char> local_748;
  basic_cstring<const_char> local_738;
  uint local_728;
  bool local_721;
  int i;
  bool all_zero;
  anon_struct_1296_7_5326303c disk_info;
  iterator __end3;
  iterator __begin3;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range3;
  undefined1 local_1f0 [5];
  bool label_found;
  bool uuid_found;
  bool preferred_found;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> local_1e0;
  assertion_result local_1c0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  undefined4 local_184;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_170;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  FUNCTION_RETURN local_124;
  undefined1 local_120 [4];
  FUNCTION_RETURN result;
  vector<DiskInfo,_std::allocator<DiskInfo>_> disk_infos;
  undefined1 local_f0 [4];
  LCC_API_VIRTUALIZATION_SUMMARY virt;
  ExecutionEnvironment exec_env;
  read_disk_id *this_local;
  
  exec_env._216_8_ = this;
  os::ExecutionEnvironment::ExecutionEnvironment((ExecutionEnvironment *)local_f0);
  LVar3 = os::ExecutionEnvironment::virtualization((ExecutionEnvironment *)local_f0);
  std::vector<DiskInfo,_std::allocator<DiskInfo>_>::vector
            ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_120);
  local_124 = getDiskInfos((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_120);
  if ((LVar3 == NONE) || (LVar3 == VM)) {
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_138,0x1b,&local_148);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_170,plVar4,(char (*) [1])"");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_180,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      local_184 = 0;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,FUNCTION_RETURN,FUNCTION_RETURN>
                (&local_170,&local_180,0x1b,1,2,&local_124,"result",&local_184,"FUNC_RET_OK");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(&local_170);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a8);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_198,0x1c,&local_1a8);
      sVar5 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::size
                        ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_120);
      boost::test_tools::assertion_result::assertion_result(&local_1c0,sVar5 != 0);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_1e0,plVar4,(char (*) [16])"Found some disk");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)local_1f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::test_tools::tt_detail::report_assertion(&local_1c0,&local_1e0,local_1f0,0x1c,2,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>::
      ~lazy_ostream_impl(&local_1e0);
      boost::test_tools::assertion_result::~assertion_result(&local_1c0);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    __range3._7_1_ = false;
    __range3._6_1_ = false;
    __range3._5_1_ = false;
    __end3 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::begin
                       ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_120);
    disk_info._1288_8_ =
         std::vector<DiskInfo,_std::allocator<DiskInfo>_>::end
                   ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_120);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>
                                       *)(disk_info.label + 0xfb)), bVar2) {
      __src = __gnu_cxx::
              __normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>::
              operator*(&__end3);
      memcpy(&i,__src,0x510);
      local_9da = 1;
      if (__range3._6_1_ == false) {
        local_9da = disk_info.disk_sn[0];
      }
      __range3._6_1_ = (bool)(local_9da & 1);
      local_9db = 1;
      if (__range3._7_1_ == false) {
        local_9db = disk_info.label[0xf8];
      }
      __range3._7_1_ = (bool)(local_9db & 1);
      local_9dc = 1;
      if (__range3._5_1_ == false) {
        local_9dc = disk_info.label[0xf7];
      }
      __range3._5_1_ = (bool)(local_9dc & 1);
      if ((disk_info.disk_sn[0] & 1) != 0) {
        local_721 = true;
        local_728 = 0;
        while( true ) {
          local_9dd = false;
          if (local_728 < 8) {
            local_9dd = local_721;
          }
          if (local_9dd == false) break;
          local_721 = disk_info.disk_sn[(long)(int)local_728 + -8] == '\0';
          local_728 = local_728 + 1;
        }
        do {
          puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    (&local_738,
                     "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                     ,0x71);
          boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_748);
          boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_738,0x2b,&local_748);
          boost::test_tools::assertion_result::assertion_result(&local_760,(bool)(~local_721 & 1));
          plVar4 = boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<(&local_780,plVar4,(char (*) [23])"disksn is not all zero");
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    (&local_790,
                     "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                     ,0x71);
          boost::test_tools::tt_detail::report_assertion
                    (&local_760,&local_780,&local_790,0x2b,1,1,0);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>::
          ~lazy_ostream_impl(&local_780);
          boost::test_tools::assertion_result::~assertion_result(&local_760);
          bVar2 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar2);
      }
      __gnu_cxx::__normal_iterator<DiskInfo_*,_std::vector<DiskInfo,_std::allocator<DiskInfo>_>_>::
      operator++(&__end3);
    }
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_7a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7b0);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_7a0,0x2e,&local_7b0);
      boost::test_tools::assertion_result::assertion_result(&local_7c8,__range3._6_1_);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_7e8,plVar4,(char (*) [30])"At least one UUID initialized")
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_7f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::test_tools::tt_detail::report_assertion(&local_7c8,&local_7e8,&local_7f8,0x2e,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>::
      ~lazy_ostream_impl(&local_7e8);
      boost::test_tools::assertion_result::~assertion_result(&local_7c8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_808,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_818);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_808,0x2f,&local_818);
      boost::test_tools::assertion_result::assertion_result(&local_830,__range3._5_1_);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_850,plVar4,(char (*) [25])"At least one label found");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_860,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::test_tools::tt_detail::report_assertion(&local_830,&local_850,&local_860,0x2f,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[25],_const_char_(&)[25]>::
      ~lazy_ostream_impl(&local_850);
      boost::test_tools::assertion_result::~assertion_result(&local_830);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_870,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_880);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_870,0x30,&local_880);
      boost::test_tools::assertion_result::assertion_result(&local_898,__range3._7_1_);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_8b8,plVar4,(char (*) [42])"At least one standard mounted file system");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_8c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::test_tools::tt_detail::report_assertion(&local_898,&local_8b8,&local_8c8,0x30,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[42],_const_char_(&)[42]>::
      ~lazy_ostream_impl(&local_8b8);
      boost::test_tools::assertion_result::~assertion_result(&local_898);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  else if (LVar3 == CONTAINER) {
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_8d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8e8);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_8d8,0x33,&local_8e8);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_910,plVar4,(char (*) [1])"");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_920,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      local_924 = 1;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,FUNCTION_RETURN,FUNCTION_RETURN>
                (&local_910,&local_920,0x33,1,2,&local_124,"result",&local_924,"FUNC_RET_NOT_AVAIL")
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(&local_910);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_938,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_948);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_938,0x34,&local_948);
      sVar5 = std::vector<DiskInfo,_std::allocator<DiskInfo>_>::size
                        ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_120);
      boost::test_tools::assertion_result::assertion_result(&local_960,sVar5 == 0);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_980,plVar4,(char (*) [14])"Found no disk");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_990,
                 "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/test/library/os_linux_test.cpp"
                 ,0x71);
      boost::test_tools::tt_detail::report_assertion(&local_960,&local_980,&local_990,0x34,2,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>::
      ~lazy_ostream_impl(&local_980);
      boost::test_tools::assertion_result::~assertion_result(&local_960);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  std::vector<DiskInfo,_std::allocator<DiskInfo>_>::~vector
            ((vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_120);
  os::ExecutionEnvironment::~ExecutionEnvironment((ExecutionEnvironment *)local_f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(read_disk_id) {
	os::ExecutionEnvironment exec_env;
	LCC_API_VIRTUALIZATION_SUMMARY virt = exec_env.virtualization();
	vector<DiskInfo> disk_infos;
	FUNCTION_RETURN result = getDiskInfos(disk_infos);
	if (virt == LCC_API_VIRTUALIZATION_SUMMARY::NONE || virt == LCC_API_VIRTUALIZATION_SUMMARY::VM) {
		BOOST_CHECK_EQUAL(result, FUNC_RET_OK);
		BOOST_REQUIRE_MESSAGE(disk_infos.size() > 0, "Found some disk");
		bool preferred_found = false;
		bool uuid_found = false;
		bool label_found = false;

		for (auto disk_info : disk_infos) {
			uuid_found = uuid_found || disk_info.sn_initialized;
			preferred_found = preferred_found || disk_info.preferred;
			label_found = label_found || disk_info.label_initialized;

			if (disk_info.sn_initialized) {
				bool all_zero = true;
				for (int i = 0; i < sizeof(disk_info.disk_sn) && all_zero; i++) {
					all_zero = (disk_info.disk_sn[i] == 0);
				}
				BOOST_CHECK_MESSAGE(!all_zero, "disksn is not all zero");
			}
		}
		BOOST_CHECK_MESSAGE(uuid_found, "At least one UUID initialized");
		BOOST_CHECK_MESSAGE(label_found, "At least one label found");
		BOOST_CHECK_MESSAGE(preferred_found, "At least one standard mounted file system");
	} else if (virt == LCC_API_VIRTUALIZATION_SUMMARY::CONTAINER) {
		// in docker or lxc diskInfo is very likely not to find any good disk.
		BOOST_CHECK_EQUAL(result, FUNC_RET_NOT_AVAIL);
		BOOST_REQUIRE_MESSAGE(disk_infos.size() == 0, "Found no disk");
	}
}